

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiPtrOrIndex *pIVar5;
  float *__src;
  float fVar6;
  uint uVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImU32 IVar10;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiPtrOrIndex *__dest;
  float *__dest_00;
  long lVar11;
  ImGuiTableColumn *pIVar12;
  char *__dest_01;
  int iVar13;
  int iVar14;
  ImRect *pIVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  size_t size;
  undefined4 in_register_00000034;
  ulong uVar19;
  ImGuiID id_00;
  ImGuiTableColumn *pIVar20;
  char *pcVar21;
  ImGuiContext *g;
  int iVar22;
  float fVar23;
  undefined4 in_XMM0_Db;
  ImVec2 IVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  ImRect outer_rect;
  ImRect local_c0;
  float *local_b0;
  ImGuiWindow *local_a8;
  ulong local_a0;
  undefined8 local_98;
  char *local_88;
  ImPool<ImGuiTable> *local_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined3 uStack_50;
  undefined5 local_4d;
  undefined3 uStack_48;
  undefined8 uStack_45;
  
  pIVar8 = GImGui;
  local_a8 = (ImGuiWindow *)CONCAT44(in_register_00000034,id);
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems == false) {
    uVar16 = (ulong)(uint)columns_count;
    if (0x3f < columns_count - 1U) {
      __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x133,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
      __assert_fail("inner_width >= 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x135,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    local_98 = (ImGuiPtrOrIndex *)CONCAT44(in_XMM0_Db,inner_width);
    IVar24 = GetContentRegionAvail();
    fVar26 = IVar24.x;
    fVar28 = IVar24.y;
    if (fVar26 <= 1.0) {
      fVar26 = 1.0;
    }
    if ((flags & 0x3000000U) == 0) {
      IVar24 = CalcItemSize(*outer_size,fVar26,0.0);
      local_c0.Min = (pIVar3->DC).CursorPos;
      local_c0.Max.y = IVar24.y + (pIVar3->DC).CursorPos.y;
      local_c0.Max.x = (pIVar3->DC).CursorPos.x + IVar24.x;
    }
    else {
      if (fVar28 <= 1.0) {
        fVar28 = 1.0;
      }
      IVar24 = CalcItemSize(*outer_size,fVar26,fVar28);
      local_c0.Min = (pIVar3->DC).CursorPos;
      local_c0.Max.y = IVar24.y + (pIVar3->DC).CursorPos.y;
      local_c0.Max.x = (pIVar3->DC).CursorPos.x + IVar24.x;
      bVar9 = IsClippedEx(&local_c0,0,false);
      if (bVar9) {
        ItemSize(&local_c0,-1.0);
        goto LAB_0015adaa;
      }
    }
    local_80 = &pIVar8->Tables;
    local_88 = name;
    p_00 = ImPool<ImGuiTable>::GetOrAddByKey(local_80,(ImGuiID)local_a8);
    iVar22 = pIVar8->FrameCount;
    iVar13 = 0;
    if (p_00->LastFrameActive == iVar22) {
      iVar13 = p_00->InstanceCurrent + 1;
    }
    local_b0 = (float *)CONCAT44(local_b0._4_4_,p_00->Flags);
    if ((0 < iVar13) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    bVar9 = (flags & 0xe000U) == 0;
    p_00->IsDefaultSizingPolicy = bVar9;
    uVar17 = flags;
    if (bVar9) {
      uVar17 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar17 = 0x2000, (pIVar3->Flags & 0x40) == 0)) {
        uVar17 = 0x8000;
      }
      uVar17 = uVar17 | flags;
    }
    uVar18 = uVar17 | 0x40000;
    if ((uVar17 & 0xe000) != 0x4000) {
      uVar18 = uVar17;
    }
    uVar17 = uVar18 & 0xfffcffff;
    if ((uVar18 & 0x3000000) == 0) {
      uVar17 = uVar18;
    }
    id_00 = iVar13 + (ImGuiID)local_a8;
    uVar7 = uVar17 & 0xfffff7ff;
    if ((uVar17 >> 0xc & 1) == 0) {
      uVar7 = uVar17;
    }
    uVar17 = (uVar18 & 1) << 9 | uVar7;
    uVar18 = uVar17 | 0x10;
    if ((uVar7 & 0xf) == 0) {
      uVar17 = uVar18;
    }
    if (((uint)pIVar3->RootWindow->Flags >> 8 & 1) != 0) {
      uVar17 = uVar18;
    }
    p_00->ID = (ImGuiID)local_a8;
    p_00->Flags = uVar17;
    p_00->InstanceCurrent = (ImS16)iVar13;
    p_00->LastFrameActive = iVar22;
    p_00->InnerWindow = pIVar3;
    p_00->OuterWindow = pIVar3;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_98;
    p_00->UserOuterSize = *outer_size;
    local_a0 = uVar16;
    if ((flags & 0x3000000U) == 0) {
      (p_00->InnerRect).Min = local_c0.Min;
      (p_00->InnerRect).Max = local_c0.Max;
      (p_00->OuterRect).Min = local_c0.Min;
      (p_00->OuterRect).Max = local_c0.Max;
      (p_00->WorkRect).Min = local_c0.Min;
      (p_00->WorkRect).Max = local_c0.Max;
    }
    else {
      fVar26 = (float)local_98;
      if ((uVar17 & 0x1000000) == 0) {
        fVar26 = 3.4028235e+38;
      }
      fVar26 = (float)(~-(uint)(0.0 < (float)local_98) & 0x7f7fffff |
                      (uint)fVar26 & -(uint)(0.0 < (float)local_98));
      if (fVar26 != 3.4028235e+38 || (uVar17 & 0x3000000) == 0x1000000) {
        if ((uVar17 & 0x3000000) == 0x1000000) {
          local_78.y = 1.1754944e-38;
        }
        else {
          local_78.y = 0.0;
        }
        local_78.x = (float)(-(uint)(fVar26 != 3.4028235e+38) & (uint)fVar26);
        SetNextWindowContentSize(&local_78);
      }
      if (((ulong)local_b0 & 0x3000000) == 0) {
        local_78.x = 0.0;
        local_78.y = 0.0;
        SetNextWindowScroll(&local_78);
      }
      local_78.x = local_c0.Max.x - local_c0.Min.x;
      local_78.y = local_c0.Max.y - local_c0.Min.y;
      BeginChildEx(local_88,id_00,&local_78,false,(uVar17 & 0x1000000) >> 0xd);
      pIVar4 = pIVar8->CurrentWindow;
      p_00->InnerWindow = pIVar4;
      IVar24 = (pIVar4->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar4->WorkRect).Min;
      (p_00->WorkRect).Max = IVar24;
      fVar26 = (pIVar4->Pos).x;
      fVar28 = (pIVar4->Pos).y;
      fVar23 = (pIVar4->Size).x;
      fVar27 = (pIVar4->Size).y;
      fVar6 = (pIVar4->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar4->Pos).x;
      (p_00->OuterRect).Min.y = fVar6;
      (p_00->OuterRect).Max.x = fVar26 + fVar23;
      (p_00->OuterRect).Max.y = fVar28 + fVar27;
      IVar24 = (pIVar4->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar4->InnerRect).Min;
      (p_00->InnerRect).Max = IVar24;
      if (((((pIVar4->WindowPadding).x != 0.0) ||
           (fVar26 = (pIVar4->WindowPadding).y, fVar26 != 0.0)) || (NAN(fVar26))) ||
         ((pIVar4->WindowBorderSize != 0.0 || (NAN(pIVar4->WindowBorderSize))))) {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                      ,0x177,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(id_00);
    pIVar4 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar4->DC).Indent.x;
    IVar24 = (pIVar4->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar4->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar24;
    p_00->HostSkipItems = pIVar4->SkipItems;
    IVar24 = (pIVar4->WorkRect).Max;
    (p_00->HostBackupWorkRect).Min = (pIVar4->WorkRect).Min;
    (p_00->HostBackupWorkRect).Max = IVar24;
    IVar24 = (pIVar4->ParentWorkRect).Max;
    (p_00->HostBackupParentWorkRect).Min = (pIVar4->ParentWorkRect).Min;
    (p_00->HostBackupParentWorkRect).Max = IVar24;
    (p_00->HostBackupColumnsOffset).x = (pIVar3->DC).ColumnsOffset.x;
    p_00->HostBackupPrevLineSize = (pIVar4->DC).PrevLineSize;
    p_00->HostBackupCurrLineSize = (pIVar4->DC).CurrLineSize;
    p_00->HostBackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
    p_00->HostBackupItemWidth = (pIVar3->DC).ItemWidth;
    p_00->HostBackupItemWidthStackSize = (pIVar3->DC).ItemWidthStack.Size;
    fVar26 = 0.0;
    fVar28 = 0.0;
    if ((uVar17 >> 9 & 1) != 0) {
      fVar28 = 1.0;
    }
    (pIVar4->DC).CurrLineSize.x = 0.0;
    (pIVar4->DC).CurrLineSize.y = 0.0;
    (pIVar4->DC).PrevLineSize.x = 0.0;
    (pIVar4->DC).PrevLineSize.y = 0.0;
    if ((uVar17 & 0x800200) == 0) {
      fVar26 = (pIVar8->Style).CellPadding.x;
    }
    fVar27 = 0.0;
    fVar23 = 0.0;
    if ((uVar17 & 0x800200) == 0x200) {
      fVar23 = (pIVar8->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar28 + fVar26;
    p_00->CellSpacingX2 = fVar26;
    p_00->CellPaddingX = fVar23;
    p_00->CellPaddingY = (pIVar8->Style).CellPadding.y;
    fVar26 = 0.0;
    if ((uVar17 >> 10 & 1) != 0) {
      fVar26 = 1.0;
    }
    if ((uVar17 >> 0x16 & 1) == 0 && (uVar17 & 0x200400) != 0) {
      fVar27 = (pIVar8->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar26 + fVar27) - fVar23;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x90 = (uint)*(ushort *)&p_00->field_0x90;
    pIVar15 = &pIVar4->ClipRect;
    if (pIVar4 == pIVar3) {
      pIVar15 = &p_00->WorkRect;
    }
    IVar24 = pIVar15->Max;
    (p_00->InnerClipRect).Min = pIVar15->Min;
    (p_00->InnerClipRect).Max = IVar24;
    fVar26 = (p_00->InnerClipRect).Min.x;
    fVar28 = (p_00->InnerClipRect).Min.y;
    fVar23 = (p_00->WorkRect).Min.x;
    fVar27 = (p_00->WorkRect).Min.y;
    uVar18 = -(uint)(fVar23 <= fVar26);
    IVar24.x = (float)(~uVar18 & (uint)fVar23 | (uint)fVar26 & uVar18);
    uVar18 = -(uint)(fVar27 <= fVar28);
    IVar24.y = (float)(~uVar18 & (uint)fVar27 | (uint)fVar28 & uVar18);
    (p_00->InnerClipRect).Min = IVar24;
    fVar28 = (p_00->InnerClipRect).Max.x;
    fVar26 = (p_00->WorkRect).Max.x;
    if (fVar26 <= fVar28) {
      fVar28 = fVar26;
    }
    fVar26 = (p_00->InnerClipRect).Max.y;
    fVar23 = (p_00->WorkRect).Max.y;
    if (fVar23 <= fVar26) {
      fVar26 = fVar23;
    }
    IVar25.y = fVar26;
    IVar25.x = fVar28;
    (p_00->InnerClipRect).Max = IVar25;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar17 >> 0x11 & 1) == 0) {
      fVar26 = (pIVar4->ClipRect).Max.y;
    }
    else {
      fVar26 = (p_00->InnerClipRect).Max.y;
      fVar28 = (pIVar4->WorkRect).Max.y;
      if (fVar28 <= fVar26) {
        fVar26 = fVar28;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar26;
    fVar26 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar26;
    p_00->RowPosY1 = fVar26;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    local_a8 = pIVar4;
    IVar10 = GetColorU32(0x2b,1.0);
    p_00->BorderColorStrong = IVar10;
    IVar10 = GetColorU32(0x2c,1.0);
    p_00->BorderColorLight = IVar10;
    uVar18 = ImPool<ImGuiTable>::GetIndex(local_80,p_00);
    iVar22 = (pIVar8->CurrentTableStack).Size;
    iVar13 = (pIVar8->CurrentTableStack).Capacity;
    if (iVar22 == iVar13) {
      iVar22 = iVar22 + 1;
      if (iVar13 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar13 / 2 + iVar13;
      }
      if (iVar22 < iVar14) {
        iVar22 = iVar14;
      }
      if (iVar13 < iVar22) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar22 << 4);
        pIVar5 = (pIVar8->CurrentTableStack).Data;
        if (pIVar5 != (ImGuiPtrOrIndex *)0x0) {
          local_98 = __dest;
          memcpy(__dest,pIVar5,(long)(pIVar8->CurrentTableStack).Size << 4);
          MemFree((pIVar8->CurrentTableStack).Data);
          __dest = local_98;
        }
        (pIVar8->CurrentTableStack).Data = __dest;
        (pIVar8->CurrentTableStack).Capacity = iVar22;
      }
    }
    pIVar4 = local_a8;
    pIVar5 = (pIVar8->CurrentTableStack).Data;
    iVar22 = (pIVar8->CurrentTableStack).Size;
    pIVar5[iVar22].Ptr = (void *)0x0;
    pIVar5[iVar22].Index = uVar18;
    (pIVar8->CurrentTableStack).Size = (pIVar8->CurrentTableStack).Size + 1;
    pIVar8->CurrentTable = p_00;
    (pIVar3->DC).CurrentTableIdx = uVar18;
    if (local_a8 != pIVar3) {
      (local_a8->DC).CurrentTableIdx = uVar18;
    }
    if ((((ulong)local_b0 & 2) != 0) && ((uVar17 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    if ((pIVar8->TablesLastTimeActive).Size <= (int)uVar18) {
      iVar22 = uVar18 + 1;
      iVar13 = (pIVar8->TablesLastTimeActive).Capacity;
      if (iVar13 <= (int)uVar18) {
        if (iVar13 == 0) {
          iVar14 = 8;
        }
        else {
          iVar14 = iVar13 / 2 + iVar13;
        }
        if (iVar14 <= iVar22) {
          iVar14 = iVar22;
        }
        if (iVar13 < iVar14) {
          __dest_00 = (float *)MemAlloc((long)iVar14 << 2);
          __src = (pIVar8->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            local_b0 = __dest_00;
            memcpy(__dest_00,__src,(long)(pIVar8->TablesLastTimeActive).Size << 2);
            MemFree((pIVar8->TablesLastTimeActive).Data);
            __dest_00 = local_b0;
          }
          (pIVar8->TablesLastTimeActive).Data = __dest_00;
          (pIVar8->TablesLastTimeActive).Capacity = iVar14;
        }
      }
      iVar13 = (pIVar8->TablesLastTimeActive).Size;
      lVar11 = (long)iVar13;
      if (iVar13 <= (int)uVar18) {
        do {
          (pIVar8->TablesLastTimeActive).Data[lVar11] = -1.0;
          lVar11 = lVar11 + 1;
        } while (iVar22 != lVar11);
      }
      (pIVar8->TablesLastTimeActive).Size = iVar22;
    }
    uVar16 = local_a0;
    if (((int)uVar18 < 0) || ((pIVar8->TablesLastTimeActive).Size <= (int)uVar18)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                    ,0x65c,"T &ImVector<float>::operator[](int) [T = float]");
    }
    (pIVar8->TablesLastTimeActive).Data[uVar18] = (float)pIVar8->Time;
    p_00->MemoryCompacted = false;
    iVar22 = (int)((ulong)((long)(p_00->Columns).DataEnd - (long)(p_00->Columns).Data) >> 3) *
             -0x3b13b13b;
    iVar13 = (int)local_a0;
    if (iVar22 != iVar13 && iVar22 != 0) {
      MemFree(p_00->RawData);
      p_00->RawData = (void *)0x0;
    }
    if (p_00->RawData == (void *)0x0) {
      TableBeginInitMemory(p_00,iVar13);
      p_00->IsSettingsRequestLoad = true;
      p_00->IsInitializing = true;
    }
    if (p_00->IsResetAllRequest == true) {
      p_00->IsInitializing = true;
      p_00->IsResetAllRequest = false;
      p_00->IsSettingsRequestLoad = false;
      p_00->IsSettingsDirty = true;
      p_00->SettingsLoadedFlags = 0;
    }
    if (p_00->IsInitializing == true) {
      p_00->SettingsOffset = -1;
      p_00->IsSortSpecsDirty = true;
      p_00->InstanceInteracted = -1;
      p_00->ContextPopupColumn = -1;
      p_00->ReorderColumn = -1;
      p_00->HoveredColumnBody = -1;
      p_00->HoveredColumnBorder = -1;
      p_00->AutoFitSingleColumn = -1;
      p_00->ResizedColumn = -1;
      p_00->LastResizedColumn = -1;
      if (0 < iVar13) {
        lVar11 = 0x60;
        uVar19 = 0;
        do {
          pIVar12 = (p_00->Columns).Data;
          pIVar20 = (ImGuiTableColumn *)((long)pIVar12 + lVar11 + -0x60);
          if ((p_00->Columns).DataEnd <= pIVar20) goto LAB_0015b870;
          uVar2 = *(undefined4 *)((long)pIVar12 + lVar11 + -0x4c);
          uStack_48 = 0;
          uStack_58 = 0;
          uStack_50 = 0;
          local_4d = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78.x = 0.0;
          local_78.y = 0.0;
          uStack_70 = 0;
          uStack_45 = 0xffffffffffffff00;
          pIVar20->Flags = 0;
          pIVar20->WidthGiven = 0.0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x58) = 0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x50) = 0xbf800000;
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x48) = 0xbf800000;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -0x44);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -0x34);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -0x24);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -0x19);
          *puVar1 = 0;
          puVar1[1] = 0xffffffffffffff00;
          *(undefined2 *)((long)pIVar12 + lVar11 + -9) = 0xffff;
          *(undefined1 *)((long)pIVar12 + lVar11 + -7) = 0xff;
          *(undefined8 *)((long)pIVar12 + lVar11 + -6) = 0;
          *(undefined4 *)((long)&pIVar12->Flags + lVar11 + 2) = 0;
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x4c) = uVar2;
          *(undefined1 *)((long)&pIVar12->Flags + lVar11) = 1;
          pcVar21 = (p_00->DisplayOrderToIndex).Data + uVar19;
          if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar21) {
            pcVar21 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
            goto LAB_0015b89c;
          }
          *pcVar21 = (char)uVar19;
          *(char *)((long)pIVar12 + lVar11 + -0xe) = (char)uVar19;
          *(undefined2 *)((long)pIVar12 + lVar11 + -6) = 0x101;
          uVar19 = uVar19 + 1;
          lVar11 = lVar11 + 0x68;
        } while ((uVar16 & 0xffffffff) != uVar19);
      }
    }
    if (p_00->IsSettingsRequestLoad == true) {
      TableLoadSettings(p_00);
    }
    fVar26 = pIVar8->FontSize;
    fVar28 = p_00->RefScale;
    if ((fVar28 != 0.0) || (NAN(fVar28))) {
      if (((fVar28 != fVar26) || (NAN(fVar28) || NAN(fVar26))) && (0 < iVar13)) {
        pIVar12 = (p_00->Columns).Data;
        uVar16 = uVar16 & 0xffffffff;
        do {
          if ((p_00->Columns).DataEnd <= pIVar12) {
LAB_0015b870:
            pcVar21 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0015b89c:
            __assert_fail("p >= Data && p < DataEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_internal.h"
                          ,0x20e,pcVar21);
          }
          pIVar12->WidthRequest = pIVar12->WidthRequest * (fVar26 / fVar28);
          pIVar12 = pIVar12 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
    }
    p_00->RefScale = fVar26;
    pIVar4->SkipItems = true;
    if (0 < (p_00->ColumnsNames).Buf.Size) {
      iVar22 = (p_00->ColumnsNames).Buf.Capacity;
      if (iVar22 < 0) {
        uVar17 = iVar22 / 2 + iVar22;
        size = 0;
        if (0 < (int)uVar17) {
          size = (size_t)uVar17;
        }
        __dest_01 = (char *)MemAlloc(size);
        pcVar21 = (p_00->ColumnsNames).Buf.Data;
        if (pcVar21 != (char *)0x0) {
          memcpy(__dest_01,pcVar21,(long)(p_00->ColumnsNames).Buf.Size);
          MemFree((p_00->ColumnsNames).Buf.Data);
        }
        (p_00->ColumnsNames).Buf.Data = __dest_01;
        (p_00->ColumnsNames).Buf.Capacity = (int)size;
      }
      (p_00->ColumnsNames).Buf.Size = 0;
    }
    TableBeginApplyRequests(p_00);
    bVar9 = true;
  }
  else {
LAB_0015adaa:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}